

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_certificate_authorities_parse_clienthello
               (SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  bool bVar1;
  size_t sVar2;
  unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter> local_30;
  CBS *local_28;
  CBS *contents_local;
  uint8_t *out_alert_local;
  SSL_HANDSHAKE *hs_local;
  
  if (contents == (CBS *)0x0) {
    hs_local._7_1_ = true;
  }
  else {
    local_28 = contents;
    contents_local = (CBS *)out_alert;
    out_alert_local = (uint8_t *)hs;
    sVar2 = CBS_len(contents);
    if (sVar2 == 0) {
      hs_local._7_1_ = false;
    }
    else {
      SSL_parse_CA_list((bssl *)&local_30,*(SSL **)out_alert_local,(uint8_t *)contents_local,
                        local_28);
      std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::operator=
                ((unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter> *)
                 (out_alert_local + 0x630),&local_30);
      std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::~unique_ptr(&local_30);
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)(out_alert_local + 0x630));
      if (bVar1) {
        hs_local._7_1_ = true;
      }
      else {
        hs_local._7_1_ = false;
      }
    }
  }
  return hs_local._7_1_;
}

Assistant:

static bool ext_certificate_authorities_parse_clienthello(SSL_HANDSHAKE *hs,
                                                          uint8_t *out_alert,
                                                          CBS *contents) {
  if (contents == NULL) {
    return true;
  }

  if (CBS_len(contents) == 0) {
    return false;
  }

  hs->ca_names = SSL_parse_CA_list(hs->ssl, out_alert, contents);
  if (!hs->ca_names) {
    return false;
  }

  return true;
}